

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator!=(Am_Value *this,Am_Wrapper *test_value)

{
  Am_ID_Tag AVar1;
  int iVar2;
  uint uVar3;
  byte local_32;
  byte local_31;
  byte local_2a;
  byte local_29;
  Am_Wrapper *test_value_local;
  Am_Value *this_local;
  
  AVar1 = Am_Type_Class(this->type);
  if (AVar1 == 0x2000) {
    local_29 = 0;
    if ((this->value).wrapper_value != test_value) {
      local_2a = 1;
      if ((test_value != (Am_Wrapper *)0x0) &&
         (local_2a = 1, (this->value).wrapper_value != (Am_Wrapper *)0x0)) {
        iVar2 = (*(((this->value).wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type
                  [6])((this->value).wrapper_value,test_value);
        local_2a = (byte)iVar2 ^ 0xff;
      }
      local_29 = local_2a;
    }
    this_local._7_1_ = (bool)(local_29 & 1);
  }
  else {
    uVar3 = (uint)this->type;
    if ((uVar3 - 2 < 2) || (uVar3 == 9)) {
      if ((this->value).wrapper_value == (Am_Wrapper *)0x0) {
        return test_value != (Am_Wrapper *)0x0;
      }
    }
    else if ((uVar3 == 0x8006) || (uVar3 == 0x8008)) {
      local_31 = 0;
      if ((this->value).wrapper_value != test_value) {
        local_32 = 1;
        if ((test_value != (Am_Wrapper *)0x0) &&
           (local_32 = 1, (this->value).wrapper_value != (Am_Wrapper *)0x0)) {
          iVar2 = (*(((this->value).wrapper_value)->super_Am_Registered_Type).
                    _vptr_Am_Registered_Type[6])((this->value).wrapper_value,test_value);
          local_32 = (byte)iVar2 ^ 0xff;
        }
        local_31 = local_32;
      }
      return (bool)(local_31 & 1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::operator!=(Am_Wrapper *test_value) const
{
  if (Am_Type_Class(type) == Am_WRAPPER)
    return (value.wrapper_value != test_value) &&
           (!test_value || !value.wrapper_value ||
            !(*value.wrapper_value == *test_value));
  switch (type) {
  case Am_STRING:
  case Am_DOUBLE:
    return (value.wrapper_value != test_value) &&
           (!test_value || !value.wrapper_value ||
            !(*value.wrapper_value == *test_value));
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    if (!value.voidptr_value)
      return test_value != nullptr;
  default:
    return true;
  }
}